

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O2

void __thiscall
chrono::ChProximityContainerSPH::ReportAllProximities
          (ChProximityContainerSPH *this,ReportProximityCallback *mcallback)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  
  p_Var4 = (_List_node_base *)&this->proximitylist;
  do {
    p_Var4 = (((_List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->proximitylist) {
      return;
    }
    uVar2 = (**(code **)(*(long *)p_Var4[1]._M_next + 0x18))();
    uVar3 = (**(code **)(*(long *)p_Var4[1]._M_next + 0x20))();
    cVar1 = (**(code **)(*(long *)mcallback + 0x10))(mcallback,uVar2,uVar3);
  } while (cVar1 != '\0');
  return;
}

Assistant:

void ChProximityContainerSPH::ReportAllProximities(ReportProximityCallback* mcallback) {
    std::list<ChProximitySPH*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        bool proceed = mcallback->OnReportProximity((*iterproximity)->GetModelA(), (*iterproximity)->GetModelB());
        if (!proceed)
            break;
        ++iterproximity;
    }
}